

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_heap.c
# Opt level: O1

void adt_heap_sortDown(adt_ary_t *heap,int32_t parentIndex,adt_heap_family heapFamily)

{
  uint uVar1;
  uint uVar2;
  void *pvVar3;
  bool bVar4;
  int32_t iVar5;
  void **ppvVar6;
  void **ppvVar7;
  void **ppvVar8;
  uint uVar9;
  int s32Index;
  bool bVar10;
  bool bVar11;
  
  while( true ) {
    if (heap == (adt_ary_t *)0x0) {
      return;
    }
    if (parentIndex < 0) {
      return;
    }
    iVar5 = adt_ary_length(heap);
    if (iVar5 <= parentIndex) {
      return;
    }
    ppvVar6 = adt_ary_get(heap,parentIndex);
    if (ppvVar6 == (void **)0x0) break;
    pvVar3 = *ppvVar6;
    s32Index = parentIndex * 2 + 1;
    if (s32Index < iVar5) {
      ppvVar7 = adt_ary_get(heap,s32Index);
      if (ppvVar7 == (void **)0x0) {
        __assert_fail("ppLeft != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/adt/src/adt_heap.c"
                      ,0x84,"void adt_heap_sortDown(adt_ary_t *, int32_t, adt_heap_family)");
      }
      uVar9 = *(uint *)((long)*ppvVar7 + 8);
      uVar1 = *(uint *)((long)pvVar3 + 8);
      if (heapFamily == ADT_MIN_HEAP) {
        bVar10 = uVar9 < uVar1;
      }
      else {
        bVar10 = uVar1 < uVar9;
      }
    }
    else {
      uVar9 = 0;
      ppvVar7 = (void **)0x0;
      bVar10 = false;
    }
    parentIndex = parentIndex * 2 + 2;
    if (parentIndex < iVar5) {
      ppvVar8 = adt_ary_get(heap,parentIndex);
      if (ppvVar8 == (void **)0x0) {
        __assert_fail("ppRight != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/adt/src/adt_heap.c"
                      ,0x96,"void adt_heap_sortDown(adt_ary_t *, int32_t, adt_heap_family)");
      }
      uVar2 = *(uint *)((long)*ppvVar8 + 8);
      uVar1 = *(uint *)((long)pvVar3 + 8);
      bVar4 = uVar2 >= uVar1 && uVar2 != uVar1;
      if (heapFamily == ADT_MIN_HEAP) {
        bVar4 = uVar2 < uVar1;
      }
      if ((bool)(bVar10 & bVar4)) {
        uVar1 = *(uint *)((long)*ppvVar8 + 8);
        if (heapFamily == ADT_MIN_HEAP) {
          bVar11 = uVar9 <= uVar1;
        }
        else {
          bVar11 = uVar1 <= uVar9;
        }
        bVar10 = (bool)(bVar11 & bVar10);
      }
    }
    else {
      ppvVar8 = (void **)0x0;
      bVar4 = false;
    }
    if (bVar10) {
      pvVar3 = *ppvVar7;
      *ppvVar7 = *ppvVar6;
      *ppvVar6 = pvVar3;
      parentIndex = s32Index;
      if (iVar5 <= s32Index * 2 + 1) {
        return;
      }
    }
    else {
      if (!bVar4) {
        return;
      }
      pvVar3 = *ppvVar8;
      *ppvVar8 = *ppvVar6;
      *ppvVar6 = pvVar3;
      if (iVar5 <= parentIndex * 2 + 1) {
        return;
      }
    }
  }
  __assert_fail("ppParent != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/adt/src/adt_heap.c"
                ,0x7c,"void adt_heap_sortDown(adt_ary_t *, int32_t, adt_heap_family)");
}

Assistant:

void adt_heap_sortDown(adt_ary_t *heap, int32_t parentIndex, adt_heap_family heapFamily){
   if ( (heap != 0) && (parentIndex>=0) ){
      int32_t curLen = adt_ary_length(heap);
      if (parentIndex < curLen ){
         bool swapLeft = false, swapRight = false;
         void **ppLeft = 0, **ppRight = 0, **ppParent;
         adt_heap_elem_t *pParentElem;
         int32_t leftChildIndex, rightChildIndex;
         uint32_t leftChildValue = 0;

         ppParent = adt_ary_get(heap, parentIndex);
         assert(ppParent != 0);
         pParentElem = *ppParent;
         //children indices at 2i+1, 2i+2
         leftChildIndex = (parentIndex<<1) + 1;
         rightChildIndex = leftChildIndex + 1;
         if(leftChildIndex < curLen){
            adt_heap_elem_t *pLeftElem;
            ppLeft = adt_ary_get(heap, leftChildIndex);
            assert(ppLeft != 0);
            pLeftElem = *ppLeft;
            leftChildValue = pLeftElem->u32Value;
            if (heapFamily == ADT_MIN_HEAP){
               if (leftChildValue < pParentElem->u32Value){
                  swapLeft = true;
               }
            }
            else {
               //implicit ADT_MAX_HEAP
               if (leftChildValue > pParentElem->u32Value){
                  swapLeft = true;
               }
            }
         }
         if( rightChildIndex < curLen ){
            adt_heap_elem_t *pRightElem;
            ppRight = adt_ary_get(heap, rightChildIndex);
            assert(ppRight != 0);
            pRightElem = *ppRight;
            if (heapFamily == ADT_MIN_HEAP){
               if (pRightElem->u32Value < pParentElem->u32Value){
                  swapRight = true;
               }
            }
            else {
               //implicit ADT_MAX_HEAP
               if (pRightElem->u32Value > pParentElem->u32Value){
                  swapRight = true;
               }
            }
            if ( (swapLeft == true) && (swapRight == true) ){
               //compare which of the two children has the lowest priority
               if (heapFamily == ADT_MIN_HEAP){
                  if (pRightElem->u32Value < leftChildValue){
                     swapLeft = false;
                  }
               }
               else {
                  //implicit ADT_MAX_HEAP
                  if (pRightElem->u32Value > leftChildValue){
                     swapLeft = false;
                  }
               }
            }
         }
         if (swapLeft == true){
            //swap parent and left child
            void *tmp;
            tmp = *ppLeft;
            *ppLeft = *ppParent;
            *ppParent = tmp;

            //call recursively on left child (trickle down)
            if ( ( (leftChildIndex<<1) + 1) < curLen) {
               adt_heap_sortDown(heap, leftChildIndex, heapFamily);
            }
         }
         else if (swapRight == true){
            //swap parent and left child
            void *tmp;
            tmp = *ppRight;
            *ppRight = *ppParent;
            *ppParent = tmp;

            //call recursively on right child (trickle down)
            if ( ( (rightChildIndex<<1) + 1) < curLen) {
               adt_heap_sortDown(heap, rightChildIndex, heapFamily);
            }
         }
         else{
            //do nothing
         }
      }
   }
}